

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QMDP.cpp
# Opt level: O0

void __thiscall
QMDP::QMDP(QMDP *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu,bool useJaohQValuesCache)

{
  byte bVar1;
  byte in_DL;
  QFunctionJAOH *in_RSI;
  QFunctionJointBeliefInterface *in_RDI;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu_00;
  void **in_stack_ffffffffffffffd8;
  QFunctionForDecPOMDP *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  pu_00 = (shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *)(in_RDI + 3);
  QFunctionInterface::QFunctionInterface((QFunctionInterface *)pu_00);
  QFunctionForDecPOMDPInterface::QFunctionForDecPOMDPInterface
            ((QFunctionForDecPOMDPInterface *)pu_00,&PTR_PTR_00d02eb8);
  QFunctionForDecPOMDP::QFunctionForDecPOMDP
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,pu_00);
  QFunctionJAOH::QFunctionJAOH
            (in_RSI,(void **)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
             (shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *)in_stack_ffffffffffffffe0);
  QFunctionJointBeliefInterface::QFunctionJointBeliefInterface
            (in_RDI,&PTR_construction_vtable_144__00d02ef0);
  *in_RDI = (QFunctionJointBeliefInterface)0xd02bd0;
  in_RDI[3] = (QFunctionJointBeliefInterface)0xd02cf0;
  in_RDI[3] = (QFunctionJointBeliefInterface)0xd02cf0;
  in_RDI[3] = (QFunctionJointBeliefInterface)0xd02cf0;
  in_RDI[10] = (QFunctionJointBeliefInterface)0xd02de8;
  *in_RDI = (QFunctionJointBeliefInterface)0xd02bd0;
  in_RDI[1] = (QFunctionJointBeliefInterface)0x0;
  *(undefined1 *)(in_RDI + 2) = 0;
  in_RDI[2].field_0x1 = bVar1 & 1;
  return;
}

Assistant:

QMDP::QMDP(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu,
           bool useJaohQValuesCache) :
    QFunctionForDecPOMDP(pu), //virtual base first
    QFunctionJAOH(pu),
    _m_p(0),
    _m_initialized(false),
    _m_useJaohQValuesCache(useJaohQValuesCache)
{
}